

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall Fl_Preferences::Node::set(Node *this,char *name,char *value)

{
  int iVar1;
  int iVar2;
  Entry *pEVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = this->nEntry_;
  if (0 < (long)iVar2) {
    pEVar3 = this->entry_;
    lVar5 = 8;
    lVar6 = 0;
    do {
      iVar1 = strcmp(name,*(char **)((long)pEVar3 + lVar5 + -8));
      if (iVar1 == 0) {
        if (value == (char *)0x0) {
          return;
        }
        pcVar4 = *(char **)((long)&pEVar3->name + lVar5);
        iVar2 = strcmp(value,pcVar4);
        if (iVar2 != 0) {
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
            pEVar3 = this->entry_;
          }
          pcVar4 = strdup(value);
          *(char **)((long)&pEVar3->name + lVar5) = pcVar4;
          this->field_0x30 = this->field_0x30 | 1;
        }
        lastEntrySet = (int)lVar6;
        return;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (iVar2 != lVar6);
  }
  if (this->NEntry_ == iVar2) {
    iVar1 = 10;
    if (iVar2 != 0) {
      iVar1 = iVar2 * 2;
    }
    this->NEntry_ = iVar1;
    pEVar3 = (Entry *)realloc(this->entry_,(long)iVar1 << 4);
    this->entry_ = pEVar3;
    iVar2 = this->nEntry_;
  }
  else {
    pEVar3 = this->entry_;
  }
  pcVar4 = strdup(name);
  pEVar3[iVar2].name = pcVar4;
  if (value == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = strdup(value);
  }
  pEVar3[iVar2].value = pcVar4;
  lastEntrySet = iVar2;
  this->nEntry_ = iVar2 + 1;
  this->field_0x30 = this->field_0x30 | 1;
  return;
}

Assistant:

void Fl_Preferences::Node::set( const char *name, const char *value )
{
  for ( int i=0; i<nEntry_; i++ ) {
    if ( strcmp( name, entry_[i].name ) == 0 ) {
      if ( !value ) return; // annotation
      if ( strcmp( value, entry_[i].value ) != 0 ) {
	if ( entry_[i].value )
	  free( entry_[i].value );
	entry_[i].value = strdup( value );
	dirty_ = 1;
      }
      lastEntrySet = i;
      return;
    }
  }
  if ( NEntry_==nEntry_ ) {
    NEntry_ = NEntry_ ? NEntry_*2 : 10;
    entry_ = (Entry*)realloc( entry_, NEntry_ * sizeof(Entry) );
  }
  entry_[ nEntry_ ].name = strdup( name );
  entry_[ nEntry_ ].value = value?strdup( value ):0;
  lastEntrySet = nEntry_;
  nEntry_++;
  dirty_ = 1;
}